

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void adjust_quant(j_decompress_ptr srcinfo,jvirt_barray_ptr *src_coef_arrays,
                 j_decompress_ptr dropinfo,jvirt_barray_ptr *drop_coef_arrays,boolean trim,
                 j_compress_ptr dstinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  JCOEF JVar5;
  JQUANT_TBL *qtblptr1_00;
  j_decompress_ptr in_RCX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  jvirt_barray_ptr in_R9;
  int k;
  int ci;
  JQUANT_TBL *qtblptr3;
  JQUANT_TBL *qtblptr2;
  JQUANT_TBL *qtblptr1;
  jpeg_component_info *compptr2;
  jpeg_component_info *compptr1;
  int local_60;
  int local_5c;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_5c = 0;
  do {
    bVar4 = false;
    if (local_5c < *(int *)((long)&(in_R9->b_s_info).close_backing_store + 4)) {
      bVar4 = local_5c < *(int *)(in_RDX + 0x38);
    }
    if (!bVar4) {
      return;
    }
    qtblptr1_00 = (JQUANT_TBL *)(*(long *)(in_RDI + 0x130) + (long)local_5c * 0x60);
    lVar1 = *(long *)(qtblptr1_00->quantval + 0x28);
    lVar2 = *(long *)(*(long *)(in_RDX + 0x130) + (long)local_5c * 0x60 + 0x50);
    for (local_60 = 0; local_60 < 0x40; local_60 = local_60 + 1) {
      if (*(short *)(lVar1 + (long)local_60 * 2) != *(short *)(lVar2 + (long)local_60 * 2)) {
        if (in_R8D == 0) {
          lVar3 = *(long *)((in_R9->b_s_info).temp_name +
                           (long)*(int *)(qtblptr1_00->quantval + 8) * 8 + 8);
          for (local_60 = 0; local_60 < 0x40; local_60 = local_60 + 1) {
            if (*(short *)(lVar1 + (long)local_60 * 2) != *(short *)(lVar2 + (long)local_60 * 2)) {
              JVar5 = largest_common_denominator
                                (*(JCOEF *)(lVar1 + (long)local_60 * 2),
                                 *(JCOEF *)(lVar2 + (long)local_60 * 2));
              *(JCOEF *)(lVar3 + (long)local_60 * 2) = JVar5;
            }
          }
          dequant_comp(in_RCX,(jpeg_component_info *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                       in_R9,qtblptr1_00);
          dequant_comp(in_RCX,(jpeg_component_info *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                       in_R9,qtblptr1_00);
        }
        else {
          requant_comp(in_RCX,(jpeg_component_info *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                       in_R9,qtblptr1_00);
        }
        break;
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

LOCAL(void)
adjust_quant(j_decompress_ptr srcinfo, jvirt_barray_ptr *src_coef_arrays,
             j_decompress_ptr dropinfo, jvirt_barray_ptr *drop_coef_arrays,
             boolean trim, j_compress_ptr dstinfo)
{
  jpeg_component_info *compptr1, *compptr2;
  JQUANT_TBL *qtblptr1, *qtblptr2, *qtblptr3;
  int ci, k;

  for (ci = 0; ci < dstinfo->num_components && ci < dropinfo->num_components;
       ci++) {
    compptr1 = srcinfo->comp_info + ci;
    compptr2 = dropinfo->comp_info + ci;
    qtblptr1 = compptr1->quant_table;
    qtblptr2 = compptr2->quant_table;
    for (k = 0; k < DCTSIZE2; k++) {
      if (qtblptr1->quantval[k] != qtblptr2->quantval[k]) {
        if (trim)
          requant_comp(dropinfo, compptr2, drop_coef_arrays[ci], qtblptr1);
        else {
          qtblptr3 = dstinfo->quant_tbl_ptrs[compptr1->quant_tbl_no];
          for (k = 0; k < DCTSIZE2; k++)
            if (qtblptr1->quantval[k] != qtblptr2->quantval[k])
              qtblptr3->quantval[k] =
                largest_common_denominator(qtblptr1->quantval[k],
                                           qtblptr2->quantval[k]);
          dequant_comp(srcinfo, compptr1, src_coef_arrays[ci], qtblptr3);
          dequant_comp(dropinfo, compptr2, drop_coef_arrays[ci], qtblptr3);
        }
        break;
      }
    }
  }
}